

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bean_ptr_impl.hpp
# Opt level: O1

A * __thiscall hiberlite::real_bean<A>::get(real_bean<A> *this)

{
  int *piVar1;
  long lVar2;
  A *pAVar3;
  runtime_error *this_00;
  bean_key local_28;
  
  if (this->forgotten == false) {
    lVar2 = (this->key).id;
    if (lVar2 != -1 && this->obj == (A *)0x0) {
      local_28.con._vptr_shared_res = (_func_int **)&PTR__shared_res_001d4578;
      local_28.con.res = (this->key).con.res;
      if (local_28.con.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
        (local_28.con.res)->refCount = (local_28.con.res)->refCount + 1;
      }
      local_28.id = lVar2;
      pAVar3 = Database::dbLoad<A>(&local_28);
      this->obj = pAVar3;
      local_28.con._vptr_shared_res = (_func_int **)&PTR__shared_res_001d4578;
      if (local_28.con.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
        piVar1 = &(local_28.con.res)->refCount;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          (*(local_28.con.res)->_vptr_shared_cnt_obj_pair[1])();
        }
      }
    }
    pAVar3 = this->obj;
    if (pAVar3 == (A *)0x0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"NULL pointer exception!");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    pAVar3 = (A *)0x0;
  }
  return pAVar3;
}

Assistant:

C* real_bean<C>::get()
{
	if(forgotten)
		return NULL;
	loadLazy();
	if(!obj)
		throw std::runtime_error("NULL pointer exception!");
	return obj;
}